

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

OpenJTalk * openjtalk_initialize(char *voice,char *dic,char *voiceDir)

{
  OpenJTalk *pOVar1;
  char voiceDir_temp [260];
  char dic_temp [260];
  char voice_temp [260];
  char local_338 [272];
  char local_228 [272];
  char local_118 [264];
  
  local_118[0] = '\0';
  if (voice != (char *)0x0) {
    u8tou8_path(voice,local_118);
  }
  local_228[0] = '\0';
  if (dic != (char *)0x0) {
    u8tou8_path(dic,local_228);
  }
  local_338[0] = '\0';
  if (voiceDir != (char *)0x0) {
    u8tou8_path(voiceDir,local_338);
  }
  pOVar1 = openjtalk_initialize_sub(local_118,local_228,local_338);
  return pOVar1;
}

Assistant:

OPENJTALK_DLL_API OpenJTalk *OPENJTALK_CONVENTION openjtalk_initialize(const char *voice, const char *dic, const char *voiceDir)
{
	char voice_temp[MAX_PATH];
	char dic_temp[MAX_PATH];
	char voiceDir_temp[MAX_PATH];

	voice_temp[0] = '\0';
	if (voice != NULL)
	{
#if defined(_WIN32)
		u8tou8_path(voice, voice_temp);
#else
		u8tou8_path(voice, voice_temp);
#endif
	}

	dic_temp[0] = '\0';
	if (dic != NULL)
	{
#if defined(_WIN32)
		u8tou8_path(dic, dic_temp);
#else
		u8tou8_path(dic, dic_temp);
#endif
	}

	voiceDir_temp[0] = '\0';
	if (voiceDir != NULL)
	{
#if defined(_WIN32)
		u8tou8_path(voiceDir, voiceDir_temp);
#else
		u8tou8_path(voiceDir, voiceDir_temp);
#endif
	}

	return openjtalk_initialize_sub(voice_temp, dic_temp, voiceDir_temp);
}